

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int wally_map_find(wally_map *map_in,uchar *key,size_t key_len,size_t *written)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  size_t *psVar4;
  bool bVar5;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar2 = -2;
  if ((((map_in != (wally_map *)0x0) && (key != (uchar *)0x0)) && (key_len != 0)) &&
     (written != (size_t *)0x0)) {
    sVar1 = map_in->num_items;
    iVar2 = 0;
    if (sVar1 != 0) {
      psVar4 = &map_in->items->key_len;
      sVar3 = 1;
      do {
        if ((*psVar4 == key_len) &&
           (iVar2 = bcmp(key,((wally_map_item *)(psVar4 + -1))->key,key_len), iVar2 == 0)) {
          *written = sVar3;
          break;
        }
        psVar4 = psVar4 + 4;
        bVar5 = sVar3 != sVar1;
        sVar3 = sVar3 + 1;
      } while (bVar5);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int wally_map_find(const struct wally_map *map_in,
                   const unsigned char *key, size_t key_len,
                   size_t *written)
{
    size_t i;

    if (written)
        *written = 0;

    if (!map_in || !key || BYTES_INVALID(key, key_len) || !written)
        return WALLY_EINVAL;

    for (i = 0; i < map_in->num_items; ++i) {
        const struct wally_map_item *item = &map_in->items[i];

        if (key_len == item->key_len && memcmp(key, item->key, key_len) == 0) {
            *written = i + 1; /* Found */
            break;
        }
    }
    return WALLY_OK;
}